

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

Write<signed_char> __thiscall
Omega_h::deep_copy<signed_char>(Omega_h *this,Read<signed_char> *a,string *name)

{
  size_type *psVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  Alloc *pAVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  void *extraout_RDX;
  LO size_in;
  ulong uVar9;
  Write<signed_char> WVar10;
  ScopedTimer omega_h_scoped_function_timer;
  string name2;
  string __str;
  ScopedTimer local_d1;
  string local_d0;
  Read<signed_char> local_b0;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  Write<signed_char> local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_90 = *puVar8;
    lStack_88 = plVar6[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar8;
    local_a0 = (ulong *)*plVar6;
  }
  local_98 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_80,3,0x15a);
  uVar9 = 0xf;
  if (local_a0 != &local_90) {
    uVar9 = local_90;
  }
  if (uVar9 < (ulong)(local_78 + local_98)) {
    uVar9 = 0xf;
    if (local_80 != local_70) {
      uVar9 = local_70[0];
    }
    if ((ulong)(local_78 + local_98) <= uVar9) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_001f9c74;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_001f9c74:
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_d0._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  begin_code("deep_copy",local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  paVar3 = &local_d0.field_2;
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar3;
  if (name->_M_string_length == 0) {
    pAVar5 = (a->write_).shared_alloc_.alloc;
    pcVar4 = (pAVar5->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar4,pcVar4 + (pAVar5->name)._M_string_length);
  }
  else {
    pcVar4 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar4,pcVar4 + name->_M_string_length);
  }
  pAVar5 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    size_in = (LO)pAVar5->size;
  }
  else {
    size_in = (LO)((ulong)pAVar5 >> 3);
  }
  Write<signed_char>::Write((Write<signed_char> *)this,size_in,&local_d0);
  local_b0.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc =
           (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b0.write_.shared_alloc_.alloc)->use_count =
           (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  local_60.shared_alloc_.alloc = *(Alloc **)this;
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_60.shared_alloc_.alloc = (Alloc *)((local_60.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.shared_alloc_.alloc)->use_count = (local_60.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.shared_alloc_.direct_ptr = *(void **)(this + 8);
  copy_into<signed_char>(&local_b0,&local_60);
  pAVar5 = local_60.shared_alloc_.alloc;
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_60.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_60.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  ScopedTimer::~ScopedTimer(&local_d1);
  WVar10.shared_alloc_.direct_ptr = extraout_RDX;
  WVar10.shared_alloc_.alloc = (Alloc *)this;
  return (Write<signed_char>)WVar10.shared_alloc_;
}

Assistant:

Write<T> deep_copy(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  auto name2 = name.empty() ? a.name() : name;
  Write<T> b(a.size(), name2);
  copy_into(a, b);
  return b;
}